

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
::prepare_insert(raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
                 *this,size_t hashval)

{
  bool bVar1;
  size_t *psVar2;
  size_t in_RSI;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
  *in_RDI;
  size_t in_stack_00000008;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
  *in_stack_00000010;
  FindInfo target;
  byte local_31;
  FindInfo local_20;
  
  local_20 = find_first_non_full(in_stack_00000010,in_stack_00000008);
  psVar2 = growth_left((raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
                        *)0x2138e6);
  local_31 = 0;
  if (*psVar2 == 0) {
    bVar1 = IsDeleted(in_RDI->ctrl_[local_20.offset]);
    local_31 = bVar1 ^ 0xff;
  }
  if ((local_31 & 1) != 0) {
    rehash_and_grow_if_necessary(in_RDI);
    local_20 = find_first_non_full(in_stack_00000010,in_stack_00000008);
  }
  in_RDI->size_ = in_RDI->size_ + 1;
  bVar1 = IsEmpty(in_RDI->ctrl_[local_20.offset]);
  psVar2 = growth_left((raw_hash_set<phmap::priv::FlatHashSetPolicy<char>,_phmap::Hash<char>,_phmap::EqualTo<char>,_std::allocator<char>_>
                        *)0x213987);
  *psVar2 = *psVar2 - (ulong)bVar1;
  HashtablezInfoHandle::RecordInsert
            ((HashtablezInfoHandle *)&in_RDI->field_0x20,in_RSI,local_20.probe_length);
  return local_20.offset;
}

Assistant:

size_t prepare_insert(size_t hashval) PHMAP_ATTRIBUTE_NOINLINE {
				auto target = find_first_non_full(hashval);
				if (PHMAP_PREDICT_FALSE(growth_left() == 0 &&
				                        !IsDeleted(ctrl_[target.offset])))
				{
					rehash_and_grow_if_necessary();
					target = find_first_non_full(hashval);
				}
				++size_;
				growth_left() -= IsEmpty(ctrl_[target.offset]);
				// set_ctrl(target.offset, H2(hashval));
				infoz_.RecordInsert(hashval, target.probe_length);
				return target.offset;
			}